

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianVariableElimination.cpp
# Opt level: O0

Result __thiscall
Inferences::GaussianVariableElimination::rewrite
          (GaussianVariableElimination *this,Clause *cl,TermList find,TermList replace,
          uint skipLiteral,bool doCheckOrdering)

{
  Literal *orig;
  uint uVar1;
  Literal **ppLVar2;
  Literal *rewritten;
  Clause *pCVar3;
  undefined8 extraout_RDX;
  Clause *in_RSI;
  uint in_R8D;
  byte in_R9B;
  Result RVar4;
  uint i;
  RStack<Literal_*> resLits;
  anon_class_16_2_58032942 checkLeq;
  bool premiseRedundant;
  Inference inf;
  SimplifyingInference1 *in_stack_fffffffffffffea8;
  Inference *in_stack_fffffffffffffeb0;
  TermList in_stack_fffffffffffffeb8;
  Clause **ppCVar5;
  TermList in_stack_fffffffffffffec0;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffef0;
  undefined8 local_f8;
  undefined4 uStack_f0;
  uint uStack_ec;
  uint local_b0;
  anon_class_16_2_58032942 local_90;
  bool local_79;
  SimplifyingInference1 local_78;
  Inference local_68;
  bool local_35;
  uint local_34;
  Clause *local_30;
  Clause *local_10;
  byte local_8;
  
  local_35 = (bool)(in_R9B & 1);
  *(int *)(DAT_01333840 + 0x184) = *(int *)(DAT_01333840 + 0x184) + 1;
  local_34 = in_R8D;
  local_30 = in_RSI;
  Kernel::SimplifyingInference1::SimplifyingInference1
            (&local_78,GAUSSIAN_VARIABLE_ELIMINIATION,in_RSI);
  Kernel::Inference::Inference(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_79 = true;
  local_90.doCheckOrdering = &local_35;
  local_90.premiseRedundant = &local_79;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_stack_fffffffffffffeb0);
  local_b0 = 0;
  while( true ) {
    uVar1 = Kernel::Clause::size(local_30);
    if (uVar1 <= local_b0) break;
    if (local_b0 != local_34) {
      in_stack_fffffffffffffef0 =
           Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x7bffc6);
      ppLVar2 = Kernel::Clause::operator[](local_30,local_b0);
      orig = *ppLVar2;
      Kernel::Clause::operator[](local_30,local_b0);
      rewritten = Kernel::EqHelper::replace
                            ((Literal *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffec0,
                             in_stack_fffffffffffffeb8);
      rewrite::anon_class_16_2_58032942::operator()(&local_90,orig,rewritten);
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffeb0,
                 (Literal *)in_stack_fffffffffffffea8);
    }
    local_b0 = local_b0 + 1;
  }
  if ((local_79 & 1U) == 0) {
    *(int *)(DAT_01333840 + 0x180) = *(int *)(DAT_01333840 + 0x180) + 1;
  }
  ppCVar5 = &local_10;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            0x7c010d);
  local_f8 = local_68._0_8_;
  uStack_f0 = local_68._8_4_;
  uStack_ec = local_68._age;
  pCVar3 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)local_68._ptr1,(Inference *)local_68._splits);
  *ppCVar5 = pCVar3;
  local_8 = local_79 & 1;
  Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff08);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            in_stack_fffffffffffffef0);
  Kernel::Inference::~Inference(&local_68);
  RVar4._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  RVar4.premiseRedundant = (bool)local_8;
  RVar4.simplified = local_10;
  return RVar4;
}

Assistant:

SimplifyingGeneratingInference1::Result GaussianVariableElimination::rewrite(Clause& cl, TermList find, TermList replace, unsigned skipLiteral, bool doCheckOrdering) const 
{
  env.statistics->gveCnt++;

  Inference inf(SimplifyingInference1(Kernel::InferenceRule::GAUSSIAN_VARIABLE_ELIMINIATION, &cl));

  bool premiseRedundant = true;

  auto checkLeq = [&](Literal* orig, Literal* rewritten) 
  { 
    if (doCheckOrdering) {
      if (rewritten != orig) {
        // as soon as we rewrite some clause x /= t \/ C[x] into C[t], the result will be incomparable
        // since the weight of t will be at least as big as the weight of x, hence we C[t] won't be smaller 
        // than C[x]
        premiseRedundant = false;
      }
    }
    return rewritten;
  };

  RStack<Literal*> resLits;
  for (unsigned i = 0; i < cl.size(); i++) {
    if (i != skipLiteral) {
      resLits->push(checkLeq(cl[i], EqHelper::replace(cl[i], find, replace)));
    }
  }

  if(!premiseRedundant) {
    env.statistics->gveViolations++;
  }

  return SimplifyingGeneratingInference1::Result{Clause::fromStack(*resLits, inf), premiseRedundant};
}